

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_List.h
# Opt level: O1

Iterator __thiscall
axl::sl::
ListBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>_>
::insertAfter(ListBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>_>
              *this,RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *p,Iterator after)

{
  size_t *psVar1;
  ListLink *link;
  ListLink *pLVar2;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *pRVar3;
  ListLink **ppLVar4;
  
  link = (ListLink *)p;
  if ((IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
       )after.
        super_IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
        .
        super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
        .m_p == (IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
                 )0x0) {
    pRVar3 = (this->
             super_ListData<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>_>).
             m_head;
    (p->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).super_MapEntry<unsigned_long,_axl::spy::ThreadState::Frame>.super_ListLink.m_prev =
         (ListLink *)0x0;
    (p->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).super_MapEntry<unsigned_long,_axl::spy::ThreadState::Frame>.super_ListLink.m_next =
         (ListLink *)pRVar3;
    if (pRVar3 == (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) {
      pRVar3 = (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)this;
    }
    (pRVar3->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).super_MapEntry<unsigned_long,_axl::spy::ThreadState::Frame>.super_ListLink.m_prev =
         (ListLink *)p;
    ppLVar4 = (ListLink **)this;
  }
  else {
    pLVar2 = *(ListLink **)
              after.
              super_IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
              .
              super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
              .m_p;
    (p->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).super_MapEntry<unsigned_long,_axl::spy::ThreadState::Frame>.super_ListLink.m_prev =
         (ListLink *)
         after.
         super_IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
         .
         super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
         .m_p;
    (p->
    super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
    ).super_MapEntry<unsigned_long,_axl::spy::ThreadState::Frame>.super_ListLink.m_next = pLVar2;
    *(RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> **)
     after.
     super_IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
     .
     super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
     .m_p = p;
    if (pLVar2 == (ListLink *)0x0) {
      pLVar2 = (ListLink *)this;
    }
    ppLVar4 = &pLVar2->m_prev;
  }
  *ppLVar4 = (ListLink *)p;
  psVar1 = &(this->super_ListData<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>_>
            ).m_count;
  *psVar1 = *psVar1 + 1;
  return (Iterator)link;
}

Assistant:

Iterator
	insertAfter(
		T* p,
		Iterator after
	) {
		if (!after)
			return insertHead(p);

		ListLink* link = GetLink()(p);
		ListLink* afterLink = after.getLink();
		ListLink* next = afterLink->m_next;

		link->m_prev = afterLink;
		link->m_next = next;
		afterLink->m_next = link;

		if (next)
			next->m_prev = link;
		else
			this->m_tail = p;

		this->m_count++;

		return Iterator::fromLink(link);
	}